

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_serialize
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_pubkey *pubkey,
              uint flags)

{
  int iVar1;
  uint uVar2;
  int local_9c;
  size_t sStack_98;
  int ret;
  size_t len;
  secp256k1_ge Q;
  uint flags_local;
  secp256k1_pubkey *pubkey_local;
  size_t *outputlen_local;
  uchar *output_local;
  secp256k1_context *ctx_local;
  
  local_9c = 0;
  Q._84_4_ = flags;
  if (outputlen == (size_t *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"outputlen != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    uVar2 = 0x41;
    if ((flags & 0x100) != 0) {
      uVar2 = 0x21;
    }
    if (*outputlen < (ulong)uVar2) {
      secp256k1_callback_call
                (&ctx->illegal_callback,
                 "*outputlen >= ((flags & SECP256K1_FLAGS_BIT_COMPRESSION) ? 33u : 65u)");
      ctx_local._4_4_ = 0;
    }
    else {
      sStack_98 = *outputlen;
      *outputlen = 0;
      if (output == (uchar *)0x0) {
        secp256k1_callback_call(&ctx->illegal_callback,"output != NULL");
        ctx_local._4_4_ = 0;
      }
      else {
        memset(output,0,sStack_98);
        if (pubkey == (secp256k1_pubkey *)0x0) {
          secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
          ctx_local._4_4_ = 0;
        }
        else if ((Q._84_4_ & 0xff) == 2) {
          iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)&len,pubkey);
          if ((iVar1 != 0) &&
             (local_9c = secp256k1_eckey_pubkey_serialize
                                   ((secp256k1_ge *)&len,output,&stack0xffffffffffffff68,
                                    Q._84_4_ & 0x100), local_9c != 0)) {
            *outputlen = sStack_98;
          }
          ctx_local._4_4_ = local_9c;
        }
        else {
          secp256k1_callback_call
                    (&ctx->illegal_callback,
                     "(flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_COMPRESSION");
          ctx_local._4_4_ = 0;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_pubkey_serialize(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_pubkey* pubkey, unsigned int flags) {
    secp256k1_ge Q;
    size_t len;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(*outputlen >= ((flags & SECP256K1_FLAGS_BIT_COMPRESSION) ? 33u : 65u));
    len = *outputlen;
    *outputlen = 0;
    ARG_CHECK(output != NULL);
    memset(output, 0, len);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_COMPRESSION);
    if (secp256k1_pubkey_load(ctx, &Q, pubkey)) {
        ret = secp256k1_eckey_pubkey_serialize(&Q, output, &len, flags & SECP256K1_FLAGS_BIT_COMPRESSION);
        if (ret) {
            *outputlen = len;
        }
    }
    return ret;
}